

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O2

void clausifyMode(Problem *problem,bool theory)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  uint uVar5;
  ImmediateSimplificationEngine *pIVar6;
  undefined4 extraout_var;
  Clause *pCVar7;
  Formula *f;
  FormulaUnit *this;
  ostream *poVar8;
  Inference *pIVar9;
  Unit *unit;
  Unit *unit_00;
  Unit *unit_01;
  ulong in_R8;
  string *unaff_R14;
  initializer_list<Kernel::Literal_*> lits;
  Options *in_stack_000000c0;
  ClauseIterator cit;
  ScopedPtr<Kernel::Problem> prb;
  NonspecificInference0 local_a2;
  string local_a0;
  CompositeISE simplifier;
  Inference local_60;
  
  simplifier.super_ImmediateSimplificationEngine.super_InferenceEngine._salg =
       (SaturationAlgorithm *)0x0;
  simplifier.super_ImmediateSimplificationEngine.super_InferenceEngine._vptr_InferenceEngine =
       (_func_int **)&PTR__CompositeISE_009fb8e0;
  simplifier._inners = (ISList *)0x0;
  simplifier._innersMany = (ISList *)0x0;
  pIVar6 = (ImmediateSimplificationEngine *)operator_new(0x10);
  (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_009fbc00;
  Inferences::CompositeISE::addFront(&simplifier,pIVar6);
  pIVar6 = (ImmediateSimplificationEngine *)operator_new(0x18);
  (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_009fc970;
  *(undefined1 *)&pIVar6[1].super_InferenceEngine._vptr_InferenceEngine = 1;
  Inferences::CompositeISE::addFront(&simplifier,pIVar6);
  pIVar6 = (ImmediateSimplificationEngine *)operator_new(0x10);
  (pIVar6->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar6->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar6->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_009fbb40;
  Inferences::CompositeISE::addFront(&simplifier,pIVar6);
  if (*(long *)(Lib::env + 0x8d70) != 0) {
    Shell::Options::sampleStrategy(in_stack_000000c0,unaff_R14);
  }
  preprocessProblem(problem);
  prb._obj = problem;
  Shell::UIHelper::outputSymbolDeclarations((ostream *)&std::cout);
  Kernel::Problem::clauseIterator((Problem *)&cit);
  bVar3 = false;
  while( true ) {
    iVar4 = (*(cit._core)->_vptr_IteratorCore[2])();
    if ((char)iVar4 == '\0') break;
    iVar4 = (*(cit._core)->_vptr_IteratorCore[3])();
    pCVar7 = Inferences::CompositeISE::simplify(&simplifier,(Clause *)CONCAT44(extraout_var,iVar4));
    if (pCVar7 != (Clause *)0x0) {
      bVar3 = (bool)(bVar3 | ((undefined1  [48])(pCVar7->super_Unit)._inference &
                             (undefined1  [48])0x18) == (undefined1  [48])0x8);
      if (theory) {
        f = Kernel::Formula::fromClause(pCVar7);
        pIVar9 = &(pCVar7->super_Unit)._inference;
        if (((uint)*(ulong *)pIVar9 & 0x1c) == 8) {
          *(ulong *)pIVar9 = *(ulong *)pIVar9 | 0xc;
        }
        this = (FormulaUnit *)Kernel::FormulaUnit::operator_new(0x48);
        Kernel::FormulaUnit::FormulaUnit(this,f,pIVar9);
        (this->super_Unit)._number = (pCVar7->super_Unit)._number;
        Shell::TPTPPrinter::toString_abi_cxx11_(&local_a0,(TPTPPrinter *)this,unit_00);
        poVar8 = std::operator<<((ostream *)&std::cout,(string *)&local_a0);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&local_a0);
      }
      else {
        Shell::TPTPPrinter::toString_abi_cxx11_(&local_a0,(TPTPPrinter *)pCVar7,unit);
        poVar8 = std::operator<<((ostream *)&std::cout,(string *)&local_a0);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
  }
  if ((!bVar3) && (*(char *)(Shell::UIHelper::_loadedPieces._16_8_ + -4) == '\x01')) {
    uVar5 = Kernel::Signature::addFreshPredicate(DAT_00a14190,0,"p",(char *)0x0);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_R8;
    local_a0._M_dataplus._M_p =
         (pointer)Kernel::Literal::create
                            ((Literal *)(ulong)uVar5,1,false,
                             (initializer_list<Kernel::TermList>)(auVar1 << 0x40));
    pIVar9 = (Inference *)0x0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_R8;
    local_a0._M_string_length =
         (size_type)
         Kernel::Literal::create
                   ((Literal *)(ulong)uVar5,0,false,
                    (initializer_list<Kernel::TermList>)(auVar2 << 0x40));
    local_a2.inputType = NEGATED_CONJECTURE;
    local_a2.rule = INPUT;
    Kernel::Inference::Inference(&local_60,&local_a2);
    lits._M_len = (size_type)&local_60;
    lits._M_array = (iterator)0x2;
    pCVar7 = Kernel::Clause::fromLiterals((Clause *)&local_a0,lits,pIVar9);
    Shell::TPTPPrinter::toString_abi_cxx11_(&local_a0,(TPTPPrinter *)pCVar7,unit_01);
    poVar8 = std::operator<<((ostream *)&std::cout,(string *)&local_a0);
    std::operator<<(poVar8,"\n");
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::string((string *)&local_a0,(string *)(Lib::env + 0x6a70));
  bVar3 = std::operator!=(&local_a0,"off");
  std::__cxx11::string::~string((string *)&local_a0);
  if (bVar3) {
    outputClausesToLaTeX(prb._obj);
  }
  vampireReturnValue = 0;
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&cit);
  Lib::ScopedPtr<Kernel::Problem>::~ScopedPtr(&prb);
  Inferences::CompositeISE::~CompositeISE(&simplifier);
  return;
}

Assistant:

void clausifyMode(Problem* problem, bool theory)
{
  CompositeISE simplifier;
  simplifier.addFront(new TrivialInequalitiesRemovalISE());
  simplifier.addFront(new TautologyDeletionISE());
  simplifier.addFront(new DuplicateLiteralRemovalISE());

  if (!env.options->strategySamplerFilename().empty()) {
    env.options->sampleStrategy(env.options->strategySamplerFilename());
  }

  ScopedPtr<Problem> prb(preprocessProblem(problem));

  //outputSymbolDeclarations deals with sorts as well for now
  //UIHelper::outputSortDeclarations(std::cout);
  UIHelper::outputSymbolDeclarations(std::cout);

  ClauseIterator cit = prb->clauseIterator();
  bool printed_conjecture = false;
  while (cit.hasNext()) {
    Clause* cl = cit.next();
    cl = simplifier.simplify(cl);
    if (!cl) {
      continue;
    }
    printed_conjecture |= cl->inputType() == UnitInputType::CONJECTURE || cl->inputType() == UnitInputType::NEGATED_CONJECTURE;
    if (theory) {
      Formula* f = Formula::fromClause(cl);

      // CONJECTURE as inputType is evil, as it cannot occur multiple times
      if (cl->inference().inputType() == UnitInputType::CONJECTURE) {
        cl->inference().setInputType(UnitInputType::NEGATED_CONJECTURE);
      }

      FormulaUnit* fu = new FormulaUnit(f,cl->inference()); // we are stealing cl's inference, which is not nice!
      fu->overwriteNumber(cl->number()); // we are also making sure it's number is the same as that of the original (for Kostya from Russia to CASC, with love, and back again)
      std::cout << TPTPPrinter::toString(fu) << "\n";
    } else {
      std::cout << TPTPPrinter::toString(cl) << "\n";
    }
  }
  if(!printed_conjecture && UIHelper::haveConjecture()){
    unsigned p = env.signature->addFreshPredicate(0,"p");
    auto c = Clause::fromLiterals({
        Literal::create(p, /* polarity */ true , {}),
        Literal::create(p, /* polarity */ false, {})
      }, 
      NonspecificInference0(UnitInputType::NEGATED_CONJECTURE,InferenceRule::INPUT));
    std::cout << TPTPPrinter::toString(c) << "\n";
  }

  if (env.options->latexOutput() != "off") { outputClausesToLaTeX(prb.ptr()); }

  //we have successfully output all clauses, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}